

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

int __thiscall QAccessibleTabBar::indexOfChild(QAccessibleTabBar *this,QAccessibleInterface *child)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QTabBar *pQVar4;
  QAccessibleTabBar *pQVar5;
  QAccessibleTabButton *tabButton;
  
  lVar3 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar3 != 0) {
    lVar3 = (**(code **)(*(long *)child + 0x18))(child);
    pQVar4 = tabBar(this);
    if (lVar3 == *(long *)(*(long *)&(pQVar4->super_QWidget).field_0x8 + 0x290)) {
      pQVar4 = tabBar(this);
      iVar2 = QTabBar::count(pQVar4);
      return iVar2;
    }
  }
  lVar3 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar3 != 0) {
    lVar3 = (**(code **)(*(long *)child + 0x18))(child);
    pQVar4 = tabBar(this);
    if (lVar3 == *(long *)(*(long *)&(pQVar4->super_QWidget).field_0x8 + 0x288)) {
      pQVar4 = tabBar(this);
      iVar2 = QTabBar::count(pQVar4);
      return iVar2 + 1;
    }
  }
  iVar1 = (**(code **)(*(long *)child + 0x78))(child);
  iVar2 = -1;
  if ((iVar1 == 0x25) &&
     (pQVar5 = (QAccessibleTabBar *)(**(code **)(*(long *)child + 0x40))(child), pQVar5 == this)) {
    iVar2 = *(int *)(child + 0x20);
  }
  return iVar2;
}

Assistant:

int QAccessibleTabBar::indexOfChild(const QAccessibleInterface *child) const
{
    if (child->object() && child->object() == tabBar()->d_func()->leftB)
        return tabBar()->count();
    if (child->object() && child->object() == tabBar()->d_func()->rightB)
        return tabBar()->count() + 1;
    if (child->role() == QAccessible::PageTab) {
        QAccessibleInterface *parent = child->parent();
        if (parent == this) {
            const QAccessibleTabButton *tabButton = static_cast<const QAccessibleTabButton *>(child);
            return tabButton->index();
        }
    }
    return -1;
}